

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_impl<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  detail tag_00;
  runtime_error *this;
  string_view tag_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (max_recursion == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,full_tag._ptr,full_tag._ptr + full_tag._len);
    std::operator+(&local_48,"Recursion limit exceeded while visiting tag: ",&local_68);
    std::runtime_error::runtime_error(this,(string *)&local_48);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((char *)tag._len != (char *)0x0) {
    tag_00 = *(detail *)tag._ptr;
    if ((byte)tag_00 < 0x3c) {
      if (tag_00 != (detail)0x28) {
        if (tag_00 == (detail)0x2f) {
          tag_01._len = (size_t)visitor;
          tag_01._ptr = (char *)tag._len;
          visit_enum<Visitor,std::ifstream>
                    ((detail *)tag._ptr,tag_01,(Visitor *)istream,
                     (basic_ifstream<char,_std::char_traits<char>_> *)visitor);
          return;
        }
LAB_0015dc54:
        visit_arithmetic<Visitor,std::ifstream>((char)tag_00,visitor,istream);
        return;
      }
      visit_tuple<Visitor,std::ifstream>(full_tag,tag,visitor,istream,max_recursion + -1);
    }
    else if (tag_00 == (detail)0x3c) {
      visit_variant<Visitor,std::ifstream>(full_tag,tag,visitor,istream,max_recursion + -1);
    }
    else if (tag_00 == (detail)0x7b) {
      visit_struct<Visitor,std::ifstream>(full_tag,tag,visitor,istream,max_recursion + -1);
    }
    else {
      if (tag_00 != (detail)0x5b) goto LAB_0015dc54;
      visit_sequence<Visitor,std::ifstream>(full_tag,tag,visitor,istream,max_recursion + -1);
    }
  }
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}